

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O2

bool __thiscall Initialize::CreateSubDirs(Initialize *this)

{
  byte bVar1;
  char cVar2;
  vector<int,_std::allocator<int>_> *this_00;
  Tools *pTVar3;
  reference pvVar4;
  Logger *pLVar5;
  bool bVar6;
  ulong uVar7;
  uint local_2e4;
  path local_2e0;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream file;
  
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file);
  uVar7 = 0;
  while( true ) {
    pTVar3 = Tools::getInstance();
    if ((ulong)((long)(pTVar3->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar3->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) break;
    std::operator+(&local_258,&this->path,"/");
    pTVar3 = Tools::getInstance();
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar3->subDirs,uVar7);
    std::operator+(&local_298,&local_258,pvVar4);
    std::filesystem::__cxx11::path::path(&local_2e0,&local_298,auto_format);
    bVar1 = std::filesystem::create_directory(&local_2e0);
    local_2e4 = (uint)bVar1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_2e4);
    std::filesystem::__cxx11::path::~path(&local_2e0);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_258);
    uVar7 = uVar7 + 1;
  }
  bVar6 = true;
  uVar7 = 0;
  while( true ) {
    pTVar3 = Tools::getInstance();
    if ((ulong)((long)(pTVar3->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar3->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) break;
    std::operator+(&local_298,&this->path,"/");
    pTVar3 = Tools::getInstance();
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar3->subDirs,uVar7);
    std::operator+(&local_2e0._M_pathname,&local_298,pvVar4);
    std::ifstream::open((string *)&file,(_Ios_Openmode)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_298);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      pLVar5 = Logger::getInstance();
      pTVar3 = Tools::getInstance();
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(pTVar3->subDirs,uVar7);
      std::operator+(&local_2e0._M_pathname,"Directory ",pvVar4);
      std::operator+(&local_278,&local_2e0._M_pathname," didn\'t create");
      Logger::LogError(pLVar5,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_2e0);
      bVar6 = false;
    }
    uVar7 = uVar7 + 1;
  }
  if (bVar6) {
    pLVar5 = Logger::getInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"Directories created successfully",(allocator<char> *)&local_2e0
              );
    Logger::LogInformation(pLVar5,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::ifstream::~ifstream(&file);
  return bVar6;
}

Assistant:

bool CreateSubDirs() {
        vector<int> *dirs = new vector<int>{};
        ifstream file;
        bool isCreated = true;
        for (int i = 0; i < Tools::getInstance()->subDirs->size(); i++) {
            dirs->push_back(filesystem::create_directory(this->path + "/" + Tools::getInstance()->subDirs->at(i)));
        }

        for (int i = 0; i < Tools::getInstance()->subDirs->size(); i++) {
            file.open(this->path + "/" + Tools::getInstance()->subDirs->at(i));
            if (!file.is_open()) {
                Logger::getInstance()->LogError(
                        "Directory " + Tools::getInstance()->subDirs->at(i) + " didn't create");
                isCreated = false;
            }
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("Directories created successfully");
        }

        return isCreated;
    }